

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O3

void __thiscall icu_63::double_conversion::Bignum::MultiplyByUInt32(Bignum *this,uint32_t factor)

{
  uint *puVar1;
  bool bVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  int i;
  ulong uVar7;
  
  if (factor != 1) {
    if (factor == 0) {
      if (0 < this->used_digits_) {
        puVar1 = (this->bigits_).start_;
        lVar5 = 0;
        do {
          puVar1[lVar5] = 0;
          lVar5 = lVar5 + 1;
        } while (lVar5 < this->used_digits_);
      }
      this->used_digits_ = 0;
      this->exponent_ = 0;
    }
    else if (0 < this->used_digits_) {
      puVar1 = (this->bigits_).start_;
      lVar5 = 0;
      uVar3 = 0;
      do {
        uVar7 = (ulong)puVar1[lVar5] * (ulong)factor + uVar3;
        puVar1[lVar5] = (uint)uVar7 & 0xfffffff;
        uVar3 = uVar7 >> 0x1c;
        lVar5 = lVar5 + 1;
        uVar6 = (ulong)this->used_digits_;
      } while (lVar5 < (long)uVar6);
      if (0xfffffff < uVar7) {
        puVar1 = (this->bigits_).start_;
        do {
          if (0x7f < (int)uVar6) {
            abort();
          }
          puVar1[(int)uVar6] = (uint)uVar3 & 0xfffffff;
          uVar4 = this->used_digits_ + 1;
          uVar6 = (ulong)uVar4;
          this->used_digits_ = uVar4;
          bVar2 = 0xfffffff < uVar3;
          uVar3 = uVar3 >> 0x1c;
        } while (bVar2);
      }
    }
  }
  return;
}

Assistant:

void Bignum::MultiplyByUInt32(uint32_t factor) {
  if (factor == 1) return;
  if (factor == 0) {
    Zero();
    return;
  }
  if (used_digits_ == 0) return;

  // The product of a bigit with the factor is of size kBigitSize + 32.
  // Assert that this number + 1 (for the carry) fits into double chunk.
  ASSERT(kDoubleChunkSize >= kBigitSize + 32 + 1);
  DoubleChunk carry = 0;
  for (int i = 0; i < used_digits_; ++i) {
    DoubleChunk product = static_cast<DoubleChunk>(factor) * bigits_[i] + carry;
    bigits_[i] = static_cast<Chunk>(product & kBigitMask);
    carry = (product >> kBigitSize);
  }
  while (carry != 0) {
    EnsureCapacity(used_digits_ + 1);
    bigits_[used_digits_] = carry & kBigitMask;
    used_digits_++;
    carry >>= kBigitSize;
  }
}